

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O0

void __thiscall
BPlusTree::InsertInternal
          (BPlusTree *this,float key,shared_ptr<Node> *parent,shared_ptr<Node> *child)

{
  pointer *ppsVar1;
  allocator<float> *paVar2;
  allocator<std::shared_ptr<void>_> *paVar3;
  float fVar4;
  bool bVar5;
  element_type *peVar6;
  size_type sVar7;
  ulong uVar8;
  reference pvVar9;
  long lVar10;
  const_iterator __last;
  const_iterator cVar11;
  __normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
  _Var12;
  shared_ptr<Node> local_298;
  shared_ptr<Node> local_288;
  shared_ptr<Node> local_278;
  undefined1 local_268 [24];
  undefined1 local_250 [8];
  shared_ptr<Node> newRoot;
  undefined1 local_238 [4];
  float newParentKey;
  shared_ptr<void> internalNode2Ptr;
  shared_ptr<void> internalNode1Ptr;
  undefined1 local_200 [8];
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> secondHalfPtr;
  undefined1 local_1d0 [8];
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> firstHalfPtr;
  const_iterator splitIter;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_1a0;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_198;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_190;
  undefined1 local_188 [8];
  vector<float,_std::allocator<float>_> secondHalfKey;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_168;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_160;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_158;
  undefined1 local_150 [8];
  vector<float,_std::allocator<float>_> firstHalfKey;
  size_t splitSize;
  const_iterator local_128;
  __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
  local_120;
  __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
  local_118;
  __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
  local_110;
  iterator ptrInsertItr_1;
  const_iterator local_100;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_f8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_f0;
  iterator keyInsertItr_1;
  int i_1;
  int insertPos_1;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> tempPtrs;
  vector<float,_std::allocator<float>_> tempKeys;
  undefined1 local_a8 [8];
  shared_ptr<Node> newInternalNode;
  const_iterator local_90;
  __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
  local_88;
  __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
  local_80;
  __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
  local_78;
  iterator ptrInsertItr;
  const_iterator local_58;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_50;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_48;
  iterator keyInsertItr;
  int i;
  int insertPos;
  shared_ptr<void> newPointer;
  shared_ptr<Node> *child_local;
  shared_ptr<Node> *parent_local;
  BPlusTree *pBStack_10;
  float key_local;
  BPlusTree *this_local;
  
  newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)child;
  parent_local._4_4_ = key;
  pBStack_10 = this;
  std::shared_ptr<void>::shared_ptr<Node,void>((shared_ptr<void> *)&i,child);
  peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)parent)
  ;
  sVar7 = std::vector<float,_std::allocator<float>_>::size(&peVar6->keys);
  if (sVar7 < this->size) {
    keyInsertItr._M_current._4_4_ = -1;
    keyInsertItr._M_current._0_4_ = 0;
    while( true ) {
      uVar8 = (ulong)(int)keyInsertItr._M_current;
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          parent);
      sVar7 = std::vector<float,_std::allocator<float>_>::size(&peVar6->keys);
      fVar4 = parent_local._4_4_;
      if (sVar7 <= uVar8) break;
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          parent);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&peVar6->keys,(long)(int)keyInsertItr._M_current);
      if (fVar4 < *pvVar9) {
        keyInsertItr._M_current._4_4_ = (int)keyInsertItr._M_current;
        break;
      }
      lVar10 = (long)(int)keyInsertItr._M_current;
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          parent);
      sVar7 = std::vector<float,_std::allocator<float>_>::size(&peVar6->keys);
      if (lVar10 == sVar7 - 1) {
        peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            parent);
        sVar7 = std::vector<float,_std::allocator<float>_>::size(&peVar6->keys);
        keyInsertItr._M_current._4_4_ = (int)sVar7;
      }
      keyInsertItr._M_current._0_4_ = (int)keyInsertItr._M_current + 1;
    }
    if (keyInsertItr._M_current._4_4_ != -1) {
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          parent);
      local_50._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin(&peVar6->keys);
      local_48 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator+(&local_50,(long)keyInsertItr._M_current._4_4_);
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          parent);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)
                 &local_58,&local_48);
      ptrInsertItr._M_current =
           (shared_ptr<void> *)
           std::vector<float,_std::allocator<float>_>::insert
                     (&peVar6->keys,local_58,(value_type_conflict *)((long)&parent_local + 4));
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          parent);
      local_88._M_current =
           (shared_ptr<void> *)
           std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::begin
                     (&peVar6->ptrs);
      local_80 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                 ::operator+(&local_88,(long)keyInsertItr._M_current._4_4_);
      local_78 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                 ::operator+(&local_80,1);
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          parent);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>
      ::__normal_iterator<std::shared_ptr<void>*>
                ((__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>
                  *)&local_90,&local_78);
      newInternalNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::insert
                     (&peVar6->ptrs,local_90,(value_type *)&i);
    }
  }
  else {
    tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 0;
    std::make_shared<Node,bool,unsigned_int&>
              ((bool *)local_a8,
               (uint *)((long)&tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        parent);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               &tempPtrs.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&peVar6->keys);
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        parent);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)&i_1,
               &peVar6->ptrs);
    keyInsertItr_1._M_current._4_4_ = -1;
    for (keyInsertItr_1._M_current._0_4_ = 0; uVar8 = (ulong)(int)keyInsertItr_1._M_current,
        sVar7 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)
                           &tempPtrs.
                            super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage),
        fVar4 = parent_local._4_4_, uVar8 < sVar7;
        keyInsertItr_1._M_current._0_4_ = (int)keyInsertItr_1._M_current + 1) {
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &tempPtrs.
                           super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(int)keyInsertItr_1._M_current);
      if (fVar4 < *pvVar9) {
        keyInsertItr_1._M_current._4_4_ = (int)keyInsertItr_1._M_current;
        break;
      }
      lVar10 = (long)(int)keyInsertItr_1._M_current;
      sVar7 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)
                         &tempPtrs.
                          super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (lVar10 == sVar7 - 1) {
        sVar7 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)
                           &tempPtrs.
                            super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        keyInsertItr_1._M_current._4_4_ = (int)sVar7;
        break;
      }
    }
    if (keyInsertItr_1._M_current._4_4_ != -1) {
      ppsVar1 = &tempPtrs.
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_f8._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)ppsVar1);
      local_f0 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator+(&local_f8,(long)keyInsertItr_1._M_current._4_4_);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)
                 &local_100,&local_f0);
      ptrInsertItr_1._M_current =
           (shared_ptr<void> *)
           std::vector<float,_std::allocator<float>_>::insert
                     ((vector<float,_std::allocator<float>_> *)ppsVar1,local_100,
                      (value_type_conflict *)((long)&parent_local + 4));
      local_120._M_current =
           (shared_ptr<void> *)
           std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::begin
                     ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)&i_1
                     );
      local_118 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                  ::operator+(&local_120,(long)keyInsertItr_1._M_current._4_4_);
      local_110 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                  ::operator+(&local_118,1);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>
      ::__normal_iterator<std::shared_ptr<void>*>
                ((__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>
                  *)&local_128,&local_110);
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::insert
                ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)&i_1,
                 local_128,(value_type *)&i);
    }
    ppsVar1 = &tempPtrs.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar7 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)ppsVar1);
    firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(sVar7 + 1 >> 1);
    local_158._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::cbegin
                            ((vector<float,_std::allocator<float>_> *)ppsVar1);
    local_168._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::cbegin
                            ((vector<float,_std::allocator<float>_> *)ppsVar1);
    local_160 = __gnu_cxx::
                __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator+(&local_168,
                          (difference_type)
                          firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    paVar2 = (allocator<float> *)
             ((long)&secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<float>::allocator(paVar2);
    std::vector<float,std::allocator<float>>::
    vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)local_150,local_158,local_160,paVar2);
    std::allocator<float>::~allocator
              ((allocator<float> *)
               ((long)&secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    ppsVar1 = &tempPtrs.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1a0._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::cbegin
                            ((vector<float,_std::allocator<float>_> *)ppsVar1);
    local_198 = __gnu_cxx::
                __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator+(&local_1a0,
                          (difference_type)
                          firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    local_190 = __gnu_cxx::
                __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator+(&local_198,1);
    __last = std::vector<float,_std::allocator<float>_>::cend
                       ((vector<float,_std::allocator<float>_> *)ppsVar1);
    paVar2 = (allocator<float> *)((long)&splitIter._M_current + 7);
    std::allocator<float>::allocator(paVar2);
    std::vector<float,std::allocator<float>>::
    vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)local_188,local_190,
               (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
               __last._M_current,paVar2);
    std::allocator<float>::~allocator((allocator<float> *)((long)&splitIter._M_current + 7));
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        parent);
    std::vector<float,_std::allocator<float>_>::operator=
              (&peVar6->keys,(vector<float,_std::allocator<float>_> *)local_150);
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_a8);
    std::vector<float,_std::allocator<float>_>::operator=
              (&peVar6->keys,(vector<float,_std::allocator<float>_> *)local_188);
    firstHalfPtr.super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::
                  cbegin((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                         &i_1);
    std::
    advance<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,unsigned_long>
              ((__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                *)&firstHalfPtr.
                   super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (unsigned_long)
               firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    cVar11 = std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::cbegin
                       ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                        &i_1);
    _Var12 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
             ::operator+((__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                          *)&firstHalfPtr.
                             super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    paVar3 = (allocator<std::shared_ptr<void>_> *)
             ((long)&secondHalfPtr.
                     super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::shared_ptr<void>_>::allocator(paVar3);
    std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,void>
              ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)local_1d0,
               (__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                )cVar11._M_current,_Var12,paVar3);
    std::allocator<std::shared_ptr<void>_>::~allocator
              ((allocator<std::shared_ptr<void>_> *)
               ((long)&secondHalfPtr.
                       super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    _Var12 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
             ::operator+((__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                          *)&firstHalfPtr.
                             super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    cVar11 = std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::cend
                       ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                        &i_1);
    paVar3 = (allocator<std::shared_ptr<void>_> *)
             ((long)&internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7);
    std::allocator<std::shared_ptr<void>_>::allocator(paVar3);
    std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,void>
              ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)local_200,
               _Var12,(__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                       )cVar11._M_current,paVar3);
    std::allocator<std::shared_ptr<void>_>::~allocator
              ((allocator<std::shared_ptr<void>_> *)
               ((long)&internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        parent);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator=
              (&peVar6->ptrs,
               (vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)local_1d0);
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_a8);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator=
              (&peVar6->ptrs,
               (vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)local_200);
    std::shared_ptr<void>::shared_ptr<Node,void>
              ((shared_ptr<void> *)
               &internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               parent);
    std::shared_ptr<void>::shared_ptr<Node,void>
              ((shared_ptr<void> *)local_238,(shared_ptr<Node> *)local_a8);
    pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &tempPtrs.
                         super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (size_type)
                        firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = *pvVar9;
    this->numNodes = this->numNodes + 1;
    bVar5 = std::operator==(parent,&this->root);
    fVar4 = newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
    if (bVar5) {
      local_268[0x17] = 0;
      std::make_shared<Node,bool,unsigned_int&>((bool *)local_250,(uint *)(local_268 + 0x17));
      this->numNodes = this->numNodes + 1;
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_250);
      std::vector<float,_std::allocator<float>_>::push_back
                (&peVar6->keys,
                 (value_type_conflict *)
                 ((long)&newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 4));
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_250);
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
                (&peVar6->ptrs,
                 (value_type *)
                 &internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_250);
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
                (&peVar6->ptrs,(value_type *)local_238);
      std::shared_ptr<Node>::operator=(&this->root,(shared_ptr<Node> *)local_250);
      std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_250);
    }
    else {
      std::shared_ptr<Node>::shared_ptr(&local_278,&this->root);
      std::shared_ptr<Node>::shared_ptr(&local_288,parent);
      FindParent((BPlusTree *)local_268,&this->root,&local_278);
      std::shared_ptr<Node>::shared_ptr(&local_298,(shared_ptr<Node> *)local_a8);
      InsertInternal(this,fVar4,(shared_ptr<Node> *)local_268,&local_298);
      std::shared_ptr<Node>::~shared_ptr(&local_298);
      std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_268);
      std::shared_ptr<Node>::~shared_ptr(&local_288);
      std::shared_ptr<Node>::~shared_ptr(&local_278);
    }
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_238);
    std::shared_ptr<void>::~shared_ptr
              ((shared_ptr<void> *)
               &internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)local_200);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)local_1d0);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_188);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_150);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)&i_1);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &tempPtrs.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_a8);
  }
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)&i);
  return;
}

Assistant:

void BPlusTree::InsertInternal(float key, std::shared_ptr<Node> parent, std::shared_ptr<Node> child) {
    std::shared_ptr<void> newPointer(child);

    // parent still have space
    if (parent->keys.size() < size) {
        int insertPos = -1;
        for (int i = 0; i < parent->keys.size(); i++) {
            if (key < parent->keys[i]) {
                insertPos = i;
                break;
            }

            if (i == parent->keys.size()-1) {
                insertPos = parent->keys.size();
            }
        }

        if (insertPos != -1) {
            // insert key in vector
            std::vector<float>::iterator keyInsertItr = parent->keys.begin() + insertPos;
            parent->keys.insert(keyInsertItr, key);

            // insert ptr in vector
            std::vector<std::shared_ptr<void>>::iterator ptrInsertItr = parent->ptrs.begin() + insertPos + 1;
            parent->ptrs.insert(ptrInsertItr, newPointer);
        }
    } else {
        // parent does not have space, split the parent node into 2
        std::shared_ptr<Node> newInternalNode = std::make_shared<Node>(false, size);

        std::vector<float> tempKeys(parent->keys);
        std::vector<std::shared_ptr<void>> tempPtrs(parent->ptrs);

        // insert into temp key & ptr
        int insertPos = -1;
        for (int i = 0; i < tempKeys.size(); i++) {
            if (key < tempKeys[i]) {
                insertPos = i;
                break;
            }

            if (i == tempKeys.size()-1) {
                insertPos = tempKeys.size();
                break;
            }
        }

        if (insertPos != -1) {
            // insert key in vector
            std::vector<float>::iterator keyInsertItr = tempKeys.begin() + insertPos;
            tempKeys.insert(keyInsertItr, key);

            // insert ptr in vector
            std::vector<std::shared_ptr<void>>::iterator ptrInsertItr = tempPtrs.begin() + insertPos + 1;
            tempPtrs.insert(ptrInsertItr, newPointer);
        }

        // split temp key & ptr
        std::size_t splitSize = (tempKeys.size() + 1)/2;
        std::vector<float> firstHalfKey(tempKeys.cbegin(), tempKeys.cbegin() + splitSize);
        std::vector<float> secondHalfKey(tempKeys.cbegin() + splitSize + 1, tempKeys.cend());    // +1 becuase for the second half dont need the first key

        parent->keys = firstHalfKey;
        newInternalNode->keys = secondHalfKey;

        std::vector<std::shared_ptr<void>>::const_iterator splitIter(tempPtrs.cbegin());
        std::advance(splitIter, splitSize);

        std::vector<std::shared_ptr<void>> firstHalfPtr(tempPtrs.cbegin(), splitIter + 1);
        std::vector<std::shared_ptr<void>> secondHalfPtr(splitIter + 1, tempPtrs.cend());

        parent->ptrs = firstHalfPtr;
        newInternalNode->ptrs = secondHalfPtr;

        std::shared_ptr<void> internalNode1Ptr(parent);
        std::shared_ptr<void> internalNode2Ptr(newInternalNode);
        float newParentKey = tempKeys[splitSize];
        numNodes++;

        if (parent == root) {
            std::shared_ptr<Node> newRoot = std::make_shared<Node>(false, size);
            numNodes++;
            newRoot->keys.push_back(newParentKey);
            newRoot->ptrs.push_back(internalNode1Ptr);
            newRoot->ptrs.push_back(internalNode2Ptr);
            root = newRoot;
        } else {
            InsertInternal(newParentKey, FindParent(root, parent), newInternalNode);
        }
    }
}